

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qht.c
# Opt level: O3

void qht_map_iter__all_locked(uc_struct *uc,qht_map *map,qht_iter *iter,void *userp)

{
  qht_iter_type qVar1;
  uc_struct *puVar2;
  void *pvVar3;
  bool bVar4;
  qht_bucket *pqVar5;
  char cVar6;
  void **ppvVar7;
  uint32_t *puVar8;
  qht_bucket *pqVar9;
  uint32_t *puVar10;
  qht_bucket *pqVar11;
  ulong uVar12;
  qht_bucket *pqVar13;
  void **ppvVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  
  if (map->n_buckets != 0) {
    uVar12 = 0;
    do {
      pqVar11 = map->buckets + uVar12;
      do {
        iVar17 = 0;
        do {
          puVar2 = (uc_struct *)pqVar11->pointers[iVar17];
          if (puVar2 == (uc_struct *)0x0) goto LAB_00d5512b;
          qVar1 = iter->type;
          if (qVar1 == QHT_ITER_RM) {
            cVar6 = (*(iter->f).retvoid)
                              (puVar2,(void *)(ulong)pqVar11->hashes[iVar17],(uint32_t)userp,
                               (void *)(ulong)qVar1);
            if (cVar6 != '\0') {
              ppvVar7 = pqVar11->pointers + iVar17;
              puVar8 = pqVar11->hashes + iVar17;
              if (iVar17 == 3) {
                if (pqVar11->next != (qht_bucket *)0x0) {
                  pvVar3 = pqVar11->next->pointers[0];
                  goto joined_r0x00d55098;
                }
              }
              else {
                pvVar3 = pqVar11->pointers[(long)iVar17 + 1];
joined_r0x00d55098:
                if (pvVar3 != (void *)0x0) {
                  pqVar9 = (qht_bucket *)0x0;
                  pqVar5 = pqVar11;
                  do {
                    pqVar13 = pqVar5;
                    lVar16 = 0;
                    do {
                      if (pqVar13->pointers[lVar16] == (void *)0x0) {
                        if (lVar16 == 0) {
                          ppvVar14 = pqVar9->pointers + 3;
                          puVar10 = pqVar9->hashes + 3;
                        }
                        else {
                          uVar15 = (int)lVar16 - 1;
                          ppvVar14 = pqVar13->pointers + uVar15;
                          puVar10 = pqVar13->hashes + uVar15;
                        }
                        goto LAB_00d550ed;
                      }
                      lVar16 = lVar16 + 1;
                    } while (lVar16 != 4);
                    pqVar9 = pqVar13;
                    pqVar5 = pqVar13->next;
                  } while (pqVar13->next != (qht_bucket *)0x0);
                  ppvVar14 = pqVar13->pointers + 3;
                  puVar10 = pqVar13->hashes + 3;
LAB_00d550ed:
                  *puVar8 = *puVar10;
                  *ppvVar7 = *ppvVar14;
                  ppvVar7 = ppvVar14;
                  puVar8 = puVar10;
                }
              }
              *puVar8 = 0;
              *ppvVar7 = (void *)0x0;
              iVar17 = iVar17 + -1;
            }
          }
          else {
            if (qVar1 != QHT_ITER_VOID) {
              g_assertion_message_expr
                        ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/util/qht.c"
                         ,0x251,(char *)0x0);
            }
            (*(iter->f).retvoid)(uc,puVar2,pqVar11->hashes[iVar17],userp);
          }
          bVar4 = iVar17 < 3;
          iVar17 = iVar17 + 1;
        } while (bVar4);
        pqVar11 = pqVar11->next;
      } while (pqVar11 != (qht_bucket *)0x0);
LAB_00d5512b:
      uVar12 = uVar12 + 1;
    } while (uVar12 < map->n_buckets);
  }
  return;
}

Assistant:

static inline void qht_map_iter__all_locked(struct uc_struct *uc, struct qht_map *map,
                                            const struct qht_iter *iter,
                                            void *userp)
{
    size_t i;

    for (i = 0; i < map->n_buckets; i++) {
        qht_bucket_iter(uc, &map->buckets[i], iter, userp);
    }
}